

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcTransportElementType::~IfcTransportElementType
          (IfcTransportElementType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x48
       = 0x8a6bc0;
  *(undefined8 *)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0x30 =
       0x8a6cb0;
  this[-1].super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.HasPropertySets.ptr.
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x8a6be8;
  *(pointer *)
   ((long)&this[-1].super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.HasPropertySets.
           ptr.
           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>_>_>
           .
           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>_>_>
   + 0x10) = (pointer)(vtable + 0x68);
  *(undefined8 *)((long)&this[-1].super_IfcElementType.super_IfcTypeProduct.Tag.ptr.field_2 + 8) =
       0x8a6c38;
  *(undefined8 *)&this[-1].super_IfcElementType.field_0x190 = 0x8a6c60;
  *(undefined8 *)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject = 0x8a6c88;
  puVar1 = *(undefined1 **)
            &(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0x10;
  if (puVar1 != &(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0x20) {
    operator_delete(puVar1);
  }
  puVar1 = &this[-1].super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x48;
  *(undefined8 *)&this[-1].super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x48
       = 0x8a6e10;
  *(undefined8 *)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0x30 =
       0x8a6ed8;
  this[-1].super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.HasPropertySets.ptr.
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x8a6e38;
  *(pointer *)
   ((long)&this[-1].super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.HasPropertySets.
           ptr.
           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>_>_>
           .
           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>_>_>
   + 0x10) = (pointer)(IfcElementType-in-Assimp::IFC::Schema_2x3::IfcTransportElementType::
                       construction_vtable + 0x68);
  *(undefined8 *)((long)&this[-1].super_IfcElementType.super_IfcTypeProduct.Tag.ptr.field_2 + 8) =
       0x8a6e88;
  *(undefined8 *)&this[-1].super_IfcElementType.field_0x190 = 0x8a6eb0;
  if (*(undefined1 **)&this[-1].field_0x1a0 != &this[-1].field_0x1b0) {
    operator_delete(*(undefined1 **)&this[-1].field_0x1a0);
  }
  IfcTypeProduct::~IfcTypeProduct((IfcTypeProduct *)puVar1,&PTR_construction_vtable_24__008a6cd0);
  operator_delete(puVar1);
  return;
}

Assistant:

IfcTransportElementType() : Object("IfcTransportElementType") {}